

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesGenericDiagonalMass.cpp
# Opt level: O2

void __thiscall
chrono::ChVariablesGenericDiagonalMass::Compute_inc_invMb_v
          (ChVariablesGenericDiagonalMass *this,ChVectorRef *result,ChVectorConstRef vect)

{
  long lVar1;
  uint __line;
  char *__assertion;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  CStack_28;
  
  lVar1 = *(long *)&(result->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8;
  if (lVar1 == this->ndof) {
    if ((vect->
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ).
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
        .m_rows.m_value == lVar1) {
      Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>>
      ::cwiseQuotient<Eigen::Matrix<double,_1,1,0,_1,1>>
                (&CStack_28,vect,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->MmassDiag);
      Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>>::
      operator+=((MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                  *)result,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&CStack_28);
      return;
    }
    __assertion = "vect.size() == ndof";
    __line = 0x30;
  }
  else {
    __assertion = "result.size() == ndof";
    __line = 0x2f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesGenericDiagonalMass.cpp"
                ,__line,
                "virtual void chrono::ChVariablesGenericDiagonalMass::Compute_inc_invMb_v(ChVectorRef, ChVectorConstRef) const"
               );
}

Assistant:

void ChVariablesGenericDiagonalMass::Compute_inc_invMb_v(ChVectorRef result, ChVectorConstRef vect) const {
    assert(result.size() == ndof);
    assert(vect.size() == ndof);
    result += vect.cwiseQuotient(MmassDiag);
}